

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

void replay_end(void)

{
  long lVar1;
  long tz_off;
  int i;
  
  if (loginfo.flog != (FILE *)0x0) {
    fclose((FILE *)loginfo.flog);
    loginfo.flog = (FILE *)0x0;
    lVar1 = get_tz_offset();
    if (lVar1 != replay_timezone) {
      log_timezone((int)lVar1);
    }
    tz_off._4_4_ = 0;
    while (saved_options[tz_off._4_4_].name != (char *)0x0) {
      nh_set_option(saved_options[tz_off._4_4_].name,saved_options[tz_off._4_4_].value,'\0');
      tz_off._4_4_ = tz_off._4_4_ + 1;
    }
    free_optlist(saved_options);
    saved_options = (nh_option_desc *)0x0;
    mfree(&diff_base);
    if (commands != (char **)0x0) {
      for (tz_off._4_4_ = 1; tz_off._4_4_ < cmdcount; tz_off._4_4_ = tz_off._4_4_ + 1) {
        free(commands[tz_off._4_4_]);
      }
      free(commands);
      commands = (char **)0x0;
    }
  }
  return;
}

Assistant:

void replay_end(void)
{
    int i;
    long tz_off;

    if (!loginfo.flog)
	return;

    fclose(loginfo.flog);
    loginfo.flog = 0;

    tz_off = get_tz_offset();
    if (tz_off != replay_timezone)
	log_timezone(tz_off);

    /* restore saved options */
    for (i = 0; saved_options[i].name; i++)
	nh_set_option(saved_options[i].name, saved_options[i].value, FALSE);
    free_optlist(saved_options);
    saved_options = NULL;

    mfree(&diff_base);

    if (!commands)
	return;
    
    for (i = 1; i < cmdcount; i++)
	free(commands[i]);
    free(commands);
    commands = NULL;
}